

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

optional<tinyusdz::value::half> * __thiscall
tinyusdz::XformOp::get_value<tinyusdz::value::half>
          (optional<tinyusdz::value::half> *__return_storage_ptr__,XformOp *this,double t,
          TimeSampleInterpolationType interp)

{
  bool bVar1;
  optional<tinyusdz::value::half> local_2c;
  half local_26;
  TimeSampleInterpolationType local_24;
  half value;
  double dStack_20;
  TimeSampleInterpolationType interp_local;
  double t_local;
  XformOp *this_local;
  
  local_24 = interp;
  dStack_20 = t;
  bVar1 = is_timesamples(this);
  if (bVar1) {
    bVar1 = get_interpolated_value<tinyusdz::value::half>(this,&local_26,dStack_20,local_24);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::half>::optional<tinyusdz::value::half,_0>
                (__return_storage_ptr__,&local_26);
    }
    else {
      nonstd::optional_lite::optional<tinyusdz::value::half>::optional(__return_storage_ptr__);
    }
  }
  else {
    primvar::PrimVar::get_value<tinyusdz::value::half>(&local_2c,&this->_var);
    nonstd::optional_lite::optional<tinyusdz::value::half>::optional<tinyusdz::value::half,_0>
              (__return_storage_ptr__,&local_2c);
    nonstd::optional_lite::optional<tinyusdz::value::half>::~optional(&local_2c);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value(double t = value::TimeCode::Default(), 
          value::TimeSampleInterpolationType interp =
               value::TimeSampleInterpolationType::Linear) const {
    if (is_timesamples()) {
      T value;
      if (get_interpolated_value(&value, t, interp)) {
        return value;
      }
      return nonstd::nullopt;
    }

    return _var.get_value<T>();
  }